

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

Function * dxil_spv::get_entry_point_function(MDNode *node)

{
  MDOperand *md;
  ConstantAsMetadata *this;
  Constant *value;
  Function *pFVar1;
  
  if (node != (MDNode *)0x0) {
    md = LLVMBC::MDNode::getOperand(node,0);
    if (md->kind != None) {
      this = LLVMBC::cast<LLVMBC::ConstantAsMetadata>(md);
      value = LLVMBC::ConstantAsMetadata::getValue(this);
      pFVar1 = LLVMBC::dyn_cast<LLVMBC::Function>(&value->super_Value);
      return pFVar1;
    }
  }
  return (Function *)0x0;
}

Assistant:

static llvm::Function *get_entry_point_function(llvm::MDNode *node)
{
	if (!node)
		return nullptr;

	auto &func_node = node->getOperand(0);

	if (func_node)
		return llvm::dyn_cast<llvm::Function>(llvm::cast<llvm::ConstantAsMetadata>(func_node)->getValue());
	else
		return nullptr;
}